

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error parse_dict(T1_Face face,T1_Loader loader,FT_Byte *base,FT_ULong size)

{
  byte bVar1;
  code cVar2;
  _func_void_PS_Table *p_Var3;
  code *__s;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  FT_UInt FVar9;
  T1_Face pTVar10;
  T1_Face pTVar11;
  PS_Table_FuncsRec *pPVar12;
  T1_FieldRec *pTVar13;
  code *__s1;
  _func_void_PS_Table *p_Var14;
  PS_Table_FuncsRec local_88;
  T1_Face local_68;
  T1_Face local_60;
  ulong local_58;
  T1_Face local_50;
  T1_Face local_48;
  T1_Face local_40;
  FT_Byte *local_38;
  
  (loader->parser).root.cursor = base;
  p_Var14 = (_func_void_PS_Table *)(base + size);
  (loader->parser).root.limit = (FT_Byte *)p_Var14;
  (loader->parser).root.error = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  local_40 = (T1_Face)&(face->type1).font_bbox;
  local_48 = (T1_Face)&(face->type1).private_dict;
  local_50 = (T1_Face)&(face->type1).font_extra;
  local_60 = (T1_Face)&face->type1;
  bVar4 = false;
  local_88.release = (_func_void_PS_Table *)0x0;
  do {
    p_Var3 = (_func_void_PS_Table *)(loader->parser).root.cursor;
    if (p_Var14 <= p_Var3) goto LAB_002654d0;
    bVar1 = (byte)*p_Var3;
    if (bVar1 != 0x46) {
      if (bVar1 != 99) {
        if (bVar1 == 0x65) {
          if (p_Var3 + 6 == p_Var14) {
LAB_00265081:
            iVar5 = strncmp((char *)p_Var3,"eexec",5);
            if (iVar5 == 0) goto LAB_0026544e;
          }
          else if (p_Var3 + 6 < p_Var14) {
            cVar2 = p_Var3[5];
            if ((((ulong)(byte)cVar2 < 0x3f) &&
                ((0x5000832100003601U >> ((ulong)(byte)cVar2 & 0x3f) & 1) != 0)) ||
               (((byte)cVar2 - 0x5b < 0x23 &&
                ((0x500000005U >> ((ulong)((byte)cVar2 - 0x5b) & 0x3f) & 1) != 0))))
            goto LAB_00265081;
          }
        }
        goto LAB_00265167;
      }
      if (p_Var3 + 10 != p_Var14) {
        if (p_Var3 + 10 < p_Var14) {
          cVar2 = p_Var3[9];
          if ((((ulong)(byte)cVar2 < 0x3f) &&
              ((0x5000832100003601U >> ((ulong)(byte)cVar2 & 0x3f) & 1) != 0)) ||
             (((byte)cVar2 - 0x5b < 0x23 &&
              ((0x500000005U >> ((ulong)((byte)cVar2 - 0x5b) & 0x3f) & 1) != 0))))
          goto LAB_002650eb;
        }
        goto LAB_00265167;
      }
LAB_002650eb:
      iVar5 = strncmp((char *)p_Var3,"closefile",9);
      if (iVar5 != 0) goto LAB_00265167;
LAB_0026544e:
      iVar5 = 3;
      goto LAB_002654bd;
    }
    if (p_Var3 + 0xe == p_Var14) {
LAB_0026514b:
      iVar5 = strncmp((char *)p_Var3,"FontDirectory",0xd);
      if (iVar5 != 0) goto LAB_00265167;
      if ((loader->keywords_encountered & 1) != 0) {
        loader->keywords_encountered = loader->keywords_encountered | 2;
      }
      (loader->parser).root.cursor = (FT_Byte *)(p_Var3 + 0xd);
LAB_002654b4:
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      iVar5 = 0;
    }
    else {
      if (p_Var3 + 0xe < p_Var14) {
        cVar2 = p_Var3[0xd];
        if ((((ulong)(byte)cVar2 < 0x3f) &&
            ((0x5000832100003601U >> ((ulong)(byte)cVar2 & 0x3f) & 1) != 0)) ||
           (((byte)cVar2 - 0x5b < 0x23 &&
            ((0x500000005U >> ((ulong)((byte)cVar2 - 0x5b) & 0x3f) & 1) != 0)))) goto LAB_0026514b;
      }
LAB_00265167:
      if (bVar1 - 0x30 < 10) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        iVar5 = 4;
        local_88.release = p_Var3;
        if ((loader->parser).root.error == 0) {
          bVar4 = true;
          goto LAB_002654b4;
        }
      }
      else if ((((p_Var3 + 6 < p_Var14 && bVar1 == 0x52) && (p_Var3[1] == (_func_void_PS_Table)0x44)
                ) && (bVar4)) ||
              (((bVar1 == 0x2d && p_Var3 + 6 < p_Var14 && (p_Var3[1] == (_func_void_PS_Table)0x7c))
               && (bVar4)))) {
        (loader->parser).root.cursor = (FT_Byte *)local_88.release;
        iVar5 = read_binary_data(&loader->parser,(FT_ULong *)&local_88,&local_38,
                                 ((face->root).internal)->incremental_interface !=
                                 (FT_Incremental_InterfaceRec *)0x0);
        if (iVar5 != 0) {
          bVar4 = false;
          goto LAB_002654b4;
        }
        local_88.done._4_4_ = 3;
        iVar5 = 1;
      }
      else if (p_Var3 + 2 < p_Var14 && bVar1 == 0x2f) {
        __s1 = p_Var3 + 1;
        (loader->parser).root.cursor = (FT_Byte *)__s1;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        iVar5 = 4;
        if ((loader->parser).root.error == 0) {
          p_Var3 = (_func_void_PS_Table *)(loader->parser).root.cursor;
          uVar7 = (long)p_Var3 - (long)__s1;
          iVar5 = 0;
          if (p_Var3 < p_Var14 && (int)uVar7 - 1U < 0x15) {
            local_58 = uVar7 & 0xffffffff;
            pTVar13 = t1_keywords;
            local_68 = face;
            do {
              __s = (code *)pTVar13->ident;
              iVar5 = 5;
              if (__s != (code *)0x0) {
                if (((*__s1 != *__s) ||
                    (local_88.add = (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)pTVar13,
                    sVar8 = strlen((char *)__s), pTVar13 = (T1_FieldRec *)local_88.add,
                    local_58 != sVar8)) ||
                   (iVar6 = bcmp(__s1,__s,local_58), pTVar13 = (T1_FieldRec *)local_88.add,
                   iVar6 != 0)) {
                  iVar5 = 0;
                  pTVar13 = pTVar13 + 1;
                  goto LAB_002652f4;
                }
                if (((*(FT_UInt *)((long)local_88.add + 0x28) &
                     (loader->keywords_encountered & 1) + 1) == 0) ||
                   (((loader->keywords_encountered & 2) != 0 &&
                    (iVar6 = strcmp((char *)__s,"CharStrings"),
                    pTVar13 = (T1_FieldRec *)local_88.add, iVar6 != 0)))) goto LAB_002652f4;
                pTVar10 = (T1_Face)local_68->blend;
                if ((pTVar10 == (T1_Face)0x0) ||
                   (pTVar11 = pTVar10,
                   *(int *)&((PS_ParserRec *)&(pTVar10->root).num_faces)->cursor == 0)) {
                  pTVar11 = (T1_Face)0x0;
                }
                if (*(T1_FieldType *)((long)local_88.add + 0xc) == T1_FIELD_TYPE_CALLBACK) {
                  (**(T1_Field_ParseFunc *)((long)local_88.add + 0x10))(&local_68->root,loader);
                  iVar6 = (loader->parser).root.error;
                }
                else {
                  switch(*(T1_FieldLocation *)((long)local_88.add + 8)) {
                  case T1_FIELD_LOCATION_FONT_EXTRA:
                    pTVar10 = local_50;
                  default:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)pTVar10;
                    break;
                  case T1_FIELD_LOCATION_FONT_INFO:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)local_60;
                    if (pTVar11 == (T1_Face)0x0) break;
                    FVar9 = *(FT_UInt *)&((PS_ParserRec *)&(pTVar11->root).num_faces)->cursor;
                    pPVar12 = (PS_Table_FuncsRec *)&(pTVar11->type1).font_info.weight;
                    goto LAB_002653f0;
                  case T1_FIELD_LOCATION_PRIVATE:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)local_48;
                    if (pTVar11 != (T1_Face)0x0) {
                      FVar9 = *(FT_UInt *)&((PS_ParserRec *)&(pTVar11->root).num_faces)->cursor;
                      pPVar12 = (PS_Table_FuncsRec *)
                                ((pTVar11->type1).private_dict.family_other_blues + 8);
                      goto LAB_002653f0;
                    }
                    break;
                  case T1_FIELD_LOCATION_BBOX:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)local_40;
                    if (pTVar11 != (T1_Face)0x0) {
                      FVar9 = *(FT_UInt *)&((PS_ParserRec *)&(pTVar11->root).num_faces)->cursor;
                      pPVar12 = (PS_Table_FuncsRec *)&(pTVar11->type1).encoding.code_last;
                      goto LAB_002653f0;
                    }
                    break;
                  case T1_FIELD_LOCATION_LOADER:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)loader;
                    break;
                  case T1_FIELD_LOCATION_FACE:
                    local_88.init = (_func_FT_Error_PS_Table_FT_Int_FT_Memory *)local_68;
                  }
                  FVar9 = 0;
                  pPVar12 = &local_88;
LAB_002653f0:
                  if (*(_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt **)pPVar12 ==
                      (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
                    iVar6 = 0;
                  }
                  else if (*(T1_FieldType *)((long)local_88.add + 0xc) - T1_FIELD_TYPE_INTEGER_ARRAY
                           < 2) {
                    iVar6 = (*(loader->parser).root.funcs.load_field_table)
                                      ((PS_Parser)loader,(T1_Field)local_88.add,&pPVar12->init,FVar9
                                       ,(FT_ULong *)0x0);
                  }
                  else {
                    iVar6 = (*(loader->parser).root.funcs.load_field)
                                      ((PS_Parser)loader,(T1_Field)local_88.add,&pPVar12->init,FVar9
                                       ,(FT_ULong *)0x0);
                  }
                }
                (loader->parser).root.error = iVar6;
                pTVar13 = (T1_FieldRec *)local_88.add;
                if (iVar6 != 0) {
                  if ((char)iVar6 == -0x5e) {
                    (loader->parser).root.error = 0;
                  }
                  else {
                    iVar5 = 1;
                    local_88.done._4_4_ = iVar6;
                  }
                }
              }
LAB_002652f4:
            } while (iVar5 == 0);
            if (iVar5 == 5) {
              iVar5 = 0;
            }
            face = local_68;
            if (iVar5 == 0) {
              bVar4 = false;
            }
          }
          else {
            bVar4 = false;
          }
        }
        if (iVar5 == 0) goto LAB_002654b4;
      }
      else {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        iVar5 = 4;
        if ((loader->parser).root.error == 0) {
          bVar4 = false;
          goto LAB_002654b4;
        }
      }
    }
LAB_002654bd:
  } while (iVar5 == 0);
  if (iVar5 - 3U < 2) {
LAB_002654d0:
    local_88.done._4_4_ = (loader->parser).root.error;
  }
  return local_88.done._4_4_;
}

Assistant:

static FT_Error
  parse_dict( T1_Face    face,
              T1_Loader  loader,
              FT_Byte*   base,
              FT_ULong   size )
  {
    T1_Parser  parser = &loader->parser;
    FT_Byte   *limit, *start_binary = NULL;
    FT_Bool    have_integer = 0;


    parser->root.cursor = base;
    parser->root.limit  = base + size;
    parser->root.error  = FT_Err_Ok;

    limit = parser->root.limit;

    T1_Skip_Spaces( parser );

    while ( parser->root.cursor < limit )
    {
      FT_Byte*  cur;


      cur = parser->root.cursor;

      /* look for `eexec' */
      if ( IS_PS_TOKEN( cur, limit, "eexec" ) )
        break;

      /* look for `closefile' which ends the eexec section */
      else if ( IS_PS_TOKEN( cur, limit, "closefile" ) )
        break;

      /* in a synthetic font the base font starts after a           */
      /* `FontDictionary' token that is placed after a Private dict */
      else if ( IS_PS_TOKEN( cur, limit, "FontDirectory" ) )
      {
        if ( loader->keywords_encountered & T1_PRIVATE )
          loader->keywords_encountered |=
            T1_FONTDIR_AFTER_PRIVATE;
        parser->root.cursor += 13;
      }

      /* check whether we have an integer */
      else if ( ft_isdigit( *cur ) )
      {
        start_binary = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 1;
      }

      /* in valid Type 1 fonts we don't see `RD' or `-|' directly */
      /* since those tokens are handled by parse_subrs and        */
      /* parse_charstrings                                        */
      else if ( *cur == 'R' && cur + 6 < limit && *( cur + 1 ) == 'D' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      else if ( *cur == '-' && cur + 6 < limit && *( cur + 1 ) == '|' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      /* look for immediates */
      else if ( *cur == '/' && cur + 2 < limit )
      {
        FT_UInt  len;


        cur++;

        parser->root.cursor = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        len = (FT_UInt)( parser->root.cursor - cur );

        if ( len > 0 && len < 22 && parser->root.cursor < limit )
        {
          /* now compare the immediate name to the keyword table */
          T1_Field  keyword = (T1_Field)t1_keywords;


          for (;;)
          {
            FT_Byte*  name;


            name = (FT_Byte*)keyword->ident;
            if ( !name )
              break;

            if ( cur[0] == name[0]                      &&
                 len == ft_strlen( (const char *)name ) &&
                 ft_memcmp( cur, name, len ) == 0       )
            {
              /* We found it -- run the parsing callback!     */
              /* We record every instance of every field      */
              /* (until we reach the base font of a           */
              /* synthetic font) to deal adequately with      */
              /* multiple master fonts; this is also          */
              /* necessary because later PostScript           */
              /* definitions override earlier ones.           */

              /* Once we encounter `FontDirectory' after      */
              /* `/Private', we know that this is a synthetic */
              /* font; except for `/CharStrings' we are not   */
              /* interested in anything that follows this     */
              /* `FontDirectory'.                             */

              /* MM fonts have more than one /Private token at */
              /* the top level; let's hope that all the junk   */
              /* that follows the first /Private token is not  */
              /* interesting to us.                            */

              /* According to Adobe Tech Note #5175 (CID-Keyed */
              /* Font Installation for ATM Software) a `begin' */
              /* must be followed by exactly one `end', and    */
              /* `begin' -- `end' pairs must be accurately     */
              /* paired.  We could use this to distinguish     */
              /* between the global Private and the Private    */
              /* dict that is a member of the Blend dict.      */

              const FT_UInt dict =
                ( loader->keywords_encountered & T1_PRIVATE )
                    ? T1_FIELD_DICT_PRIVATE
                    : T1_FIELD_DICT_FONTDICT;


              if ( !( dict & keyword->dict ) )
              {
                FT_TRACE1(( "parse_dict: found `%s' but ignoring it"
                            " since it is in the wrong dictionary\n",
                            keyword->ident ));
                break;
              }

              if ( !( loader->keywords_encountered &
                      T1_FONTDIR_AFTER_PRIVATE     )                  ||
                   ft_strcmp( (const char*)name, "CharStrings" ) == 0 )
              {
                parser->root.error = t1_load_keyword( face,
                                                      loader,
                                                      keyword );
                if ( parser->root.error )
                {
                  if ( FT_ERR_EQ( parser->root.error, Ignore ) )
                    parser->root.error = FT_Err_Ok;
                  else
                    return parser->root.error;
                }
              }
              break;
            }

            keyword++;
          }
        }

        have_integer = 0;
      }
      else
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 0;
      }

      T1_Skip_Spaces( parser );
    }

  Exit:
    return parser->root.error;
  }